

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::clear_no_resize(dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *this)

{
  size_type sVar1;
  pointer ppcVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  float fVar6;
  
  if ((this->num_elements != 0) && (sVar1 = this->num_buckets, sVar1 != 0)) {
    ppcVar2 = this->table;
    sVar5 = 0;
    do {
      ppcVar2[sVar5] = (this->key_info).empty_key;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  uVar4 = this->num_buckets;
  fVar6 = (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          enlarge_factor_ * (float)uVar4;
  uVar3 = (ulong)fVar6;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  fVar6 = (float)uVar4 *
          (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          shrink_factor_;
  uVar4 = (ulong)fVar6;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  this->num_deleted = 0;
  this->num_elements = 0;
  return;
}

Assistant:

void clear_no_resize() {
    if (num_elements > 0) {
      assert(table);
      destroy_buckets(0, num_buckets);
      fill_range_with_empty(table, num_buckets);
    }
    // don't consider to shrink before another erase()
    settings.reset_thresholds(bucket_count());
    num_elements = 0;
    num_deleted = 0;
  }